

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  char cVar1;
  byte bVar2;
  xpath_variable *pxVar3;
  type_t type;
  uint *puVar4;
  xpath_node_set_raw *extraout_RAX;
  xpath_node_set_raw *extraout_RAX_00;
  xpath_node_set_raw *extraout_RAX_01;
  xml_node_struct *pxVar5;
  xpath_node_set_raw *extraout_RAX_02;
  xpath_node_set_raw *pxVar6;
  bool once;
  xpath_allocator_capture cr;
  xpath_node_set_raw rs;
  xpath_stack swapped_stack;
  xpath_allocator_capture local_78;
  xpath_node_set_raw local_58;
  xpath_stack local_38;
  
  cVar1 = this->_type;
  puVar4 = &switchD_00126440::switchdataD_00131a50;
  switch(cVar1) {
  case '\x0f':
    local_78._target = stack->temp;
    local_78._state._root = (local_78._target)->_root;
    local_78._state._root_size = (local_78._target)->_root_size;
    local_78._state._error = (local_78._target)->_error;
    local_38.temp = stack->result;
    local_38.result = local_78._target;
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval);
    eval_node_set(&local_58,this->_right,c,&local_38,eval);
    __return_storage_ptr__->_type = type_unsorted;
    xpath_node_set_raw::append(__return_storage_ptr__,local_58._begin,local_58._end,stack->result);
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    xpath_allocator_capture::~xpath_allocator_capture(&local_78);
    puVar4 = &extraout_RAX->_type;
    break;
  case '\x11':
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,(uint)(this->_test == '\x03') * 2);
    type = __return_storage_ptr__->_type;
    if (this->_test != '\x01') {
      type = xpath_sort(__return_storage_ptr__->_begin,__return_storage_ptr__->_end,type,false);
      __return_storage_ptr__->_type = type;
    }
    once = eval == nodeset_eval_any;
    if (type == type_sorted) {
      once = eval != nodeset_eval_all;
    }
    apply_predicate(this,__return_storage_ptr__,0,stack,once);
    return extraout_RAX_00;
  case '\x14':
    pxVar3 = (this->_data).variable;
    if (pxVar3->_type != (int)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x2a92,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    if (this->_rettype == '\x01') {
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_type = pxVar3[1]._type;
      xpath_node_set_raw::append
                (__return_storage_ptr__,(xpath_node *)pxVar3[2]._next,*(xpath_node **)(pxVar3 + 3),
                 stack->result);
      return extraout_RAX_01;
    }
  case '\x10':
  case '\x12':
  case '\x13':
  case '\x15':
  case '\x16':
  case '\x17':
switchD_00126440_caseD_10:
    __assert_fail("false && \"Wrong expression for return type node set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x2aa3,
                  "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                 );
  default:
    if (cVar1 != '8') {
      if (cVar1 == '9') {
        if (this->_right != (xpath_ast_node *)0x0) {
          __assert_fail("!_right",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x2a84,
                        "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                       );
        }
        __return_storage_ptr__->_begin = (xpath_node *)0x0;
        __return_storage_ptr__->_end = (xpath_node *)0x0;
        __return_storage_ptr__->_eos = (xpath_node *)0x0;
        __return_storage_ptr__->_type = type_sorted;
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          pxVar5 = (c->n)._node._root;
        }
        else {
          xml_node::xml_node((xml_node *)&local_78);
          pxVar5 = (xml_node_struct *)local_78._target;
        }
        if (pxVar5 == (xml_node_struct *)0x0) {
          if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
            return (xpath_node_set_raw *)0x0;
          }
        }
        else if ((c->n)._attribute._attr != (xml_attribute_struct *)0x0) {
          c = (xpath_context *)&local_58;
          xml_node::xml_node((xml_node *)c);
        }
        pxVar5 = (c->n)._node._root;
        if (pxVar5 == (xml_node_struct *)0x0) {
          xml_node::xml_node((xml_node *)&local_58);
        }
        else {
          xml_node::xml_node((xml_node *)&local_58,
                             (xml_node_struct *)
                             (*(long *)((long)pxVar5 - (pxVar5->header >> 8)) + -0x40));
        }
        local_38.result = (xpath_allocator *)local_58._0_8_;
        xpath_node::xpath_node((xpath_node *)&local_78,(xml_node *)&local_38);
        pxVar6 = (xpath_node_set_raw *)__return_storage_ptr__->_end;
        if (pxVar6 != (xpath_node_set_raw *)__return_storage_ptr__->_eos) {
          __return_storage_ptr__->_end = (xpath_node *)&pxVar6->_end;
          *(xpath_allocator **)pxVar6 = local_78._target;
          pxVar6->_begin = (xpath_node *)local_78._state._root;
          return pxVar6;
        }
        xpath_node_set_raw::push_back_grow
                  (__return_storage_ptr__,(xpath_node *)&local_78,stack->result);
        return extraout_RAX_02;
      }
      goto switchD_00126440_caseD_10;
    }
    bVar2 = this->_axis;
    if (0xc < (ulong)bVar2) {
      __assert_fail("false && \"Unknown axis\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x2a7d,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    puVar4 = (uint *)((long)&switchD_00126607::switchdataD_00131a78 +
                     (long)(int)(&switchD_00126607::switchdataD_00131a78)[bVar2]);
    switch(bVar2) {
    case 0:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 1:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 2:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 3:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 4:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 5:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 6:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 7:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 9:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 10:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 0xb:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    case 0xc:
      pxVar6 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar6;
    }
  case '\x18':
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
  }
  return (xpath_node_set_raw *)puVar4;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}
			}

			// fallthrough
			default:
				assert(false && "Wrong expression for return type node set"); // unreachable
				return xpath_node_set_raw();
			}
		}